

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::ScrollAreaPrivate::updateWidgetPosition(ScrollAreaPrivate *this)

{
  LayoutDirection LVar1;
  int iVar2;
  int iVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  undefined1 auVar6 [16];
  int local_bc;
  int local_b0;
  QRect local_88;
  QSize local_78;
  Int local_70;
  undefined1 local_6c [8];
  QRect aligned;
  QPoint local_54;
  QRect local_4c;
  QRect local_3c;
  undefined1 local_2c [8];
  QRect scrolled;
  LayoutDirection dir;
  ScrollArea *q;
  ScrollAreaPrivate *this_local;
  
  register0x00000000 = q_func(this);
  LVar1 = QWidget::layoutDirection();
  scrolled.x2 = LVar1;
  local_3c = QWidget::rect((this->super_AbstractScrollAreaPrivate).viewport);
  iVar2 = QPoint::x(&(this->super_AbstractScrollAreaPrivate).topLeftCorner);
  iVar3 = QPoint::y(&(this->super_AbstractScrollAreaPrivate).topLeftCorner);
  QPoint::QPoint(&local_54,-iVar2,-iVar3);
  pQVar4 = QPointer<QWidget>::operator->(&this->widget);
  aligned._8_8_ = QWidget::size(pQVar4);
  QRect::QRect(&local_4c,&local_54,(QSize *)&aligned.x2);
  auVar6 = QStyle::visualRect(LVar1,(QRect *)&local_3c,(QRect *)&local_4c);
  iVar2 = scrolled.x2;
  scrolled._0_8_ = auVar6._8_8_;
  local_2c = auVar6._0_8_;
  local_70 = (this->alignment).i;
  pQVar4 = QPointer<QWidget>::operator->(&this->widget);
  local_78 = QWidget::size(pQVar4);
  local_88 = QWidget::rect((this->super_AbstractScrollAreaPrivate).viewport);
  auVar6 = QStyle::alignedRect(iVar2,(QFlags_conflict1 *)(ulong)local_70,(QSize *)&local_78,
                               (QRect *)&local_88);
  aligned._0_8_ = auVar6._8_8_;
  local_6c = auVar6._0_8_;
  pQVar4 = QPointer<QWidget>::operator->(&this->widget);
  pQVar5 = QPointer<QWidget>::operator->(&this->widget);
  iVar2 = QWidget::width(pQVar5);
  iVar3 = QWidget::width((this->super_AbstractScrollAreaPrivate).viewport);
  if (iVar2 < iVar3) {
    local_b0 = QRect::x((QRect *)local_6c);
  }
  else {
    local_b0 = QRect::x((QRect *)local_2c);
  }
  pQVar5 = QPointer<QWidget>::operator->(&this->widget);
  iVar2 = QWidget::height(pQVar5);
  iVar3 = QWidget::height((this->super_AbstractScrollAreaPrivate).viewport);
  if (iVar2 < iVar3) {
    local_bc = QRect::y((QRect *)local_6c);
  }
  else {
    local_bc = QRect::y((QRect *)local_2c);
  }
  QWidget::move(pQVar4,local_b0,local_bc);
  return;
}

Assistant:

void
ScrollAreaPrivate::updateWidgetPosition()
{
	ScrollArea * q = q_func();

	const Qt::LayoutDirection dir = q->layoutDirection();

	const QRect scrolled = QStyle::visualRect( dir, viewport->rect(),
		QRect( QPoint( -topLeftCorner.x(), -topLeftCorner.y() ), widget->size() ) );
	const QRect aligned = QStyle::alignedRect( dir, alignment, widget->size(),
		viewport->rect() );

	widget->move( widget->width() < viewport->width() ? aligned.x() : scrolled.x(),
		widget->height() < viewport->height() ? aligned.y() : scrolled.y() );
}